

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::removeRows(SPxLPBase<double> *this,int *nums,int n,int *perm)

{
  int *piVar1;
  int iVar2;
  long in_RCX;
  int in_EDX;
  DataArray<int> *in_RSI;
  DataArray<int> *in_RDI;
  int i;
  DataArray<int> p;
  Real in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int local_48;
  DataArray<int> local_38;
  long local_20;
  int local_14;
  DataArray<int> *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (in_RCX == 0) {
    nRows((SPxLPBase<double> *)0x202a27);
    DataArray<int>::DataArray
              (in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0)
    ;
    piVar1 = DataArray<int>::get_ptr(&local_38);
    (**(code **)(*(long *)in_RDI + 0x98))(in_RDI,local_10,local_14,piVar1);
    DataArray<int>::~DataArray(local_10);
  }
  else {
    local_20 = in_RCX;
    local_48 = nRows((SPxLPBase<double> *)0x202aae);
    while (local_48 = local_48 + -1, -1 < local_48) {
      *(int *)(local_20 + (long)local_48 * 4) = local_48;
    }
    while (iVar2 = local_14 + -1, local_14 != 0) {
      *(undefined4 *)(local_20 + (long)(&local_10->thesize)[iVar2] * 4) = 0xffffffff;
      local_14 = iVar2;
    }
    local_14 = iVar2;
    (**(code **)(*(long *)in_RDI + 0x88))(in_RDI,local_20);
  }
  return;
}

Assistant:

virtual void removeRows(int nums[], int n, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         DataArray < int > p(nRows());
         removeRows(nums, n, p.get_ptr());
         return;
      }

      for(int i = nRows() - 1; i >= 0; --i)
         perm[i] = i;

      while(n--)
         perm[nums[n]] = -1;

      removeRows(perm);
   }